

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerBailOnTrue(Lowerer *this,Instr *instr,LabelInstr *labelBailOut)

{
  Instr *pIVar1;
  IRType type;
  LabelInstr *target;
  Opnd *pOVar2;
  RegOpnd *dst;
  RegOpnd *regSrc1;
  LabelInstr *continueLabel;
  Instr *instrPrev;
  LabelInstr *labelBailOut_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  target = IR::Instr::GetOrCreateContinueLabel(instr,false);
  pOVar2 = IR::Instr::GetSrc1(instr);
  type = IR::Opnd::GetType(pOVar2);
  dst = IR::RegOpnd::New(type,this->m_func);
  pOVar2 = IR::Instr::UnlinkSrc1(instr);
  InsertMove(&dst->super_Opnd,pOVar2,instr,true);
  InsertTestBranch(&dst->super_Opnd,&dst->super_Opnd,BrEq_A,target,instr);
  GenerateBailOut(this,instr,(BranchInstr *)0x0,labelBailOut,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerBailOnTrue(IR::Instr* instr, IR::LabelInstr* labelBailOut /*nullptr*/)
{
    IR::Instr* instrPrev = instr->m_prev;

    IR::LabelInstr* continueLabel = instr->GetOrCreateContinueLabel();
    IR::RegOpnd * regSrc1 = IR::RegOpnd::New(instr->GetSrc1()->GetType(), this->m_func);
    InsertMove(regSrc1, instr->UnlinkSrc1(), instr);
    InsertTestBranch(regSrc1, regSrc1, Js::OpCode::BrEq_A, continueLabel, instr);

    GenerateBailOut(instr, nullptr, labelBailOut);

    return instrPrev;
}